

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

storage_t *
init_storage(fdb_config *m_fconfig,fdb_config *r_fconfig,fdb_kvs_config *kvs_config,
            idx_prams_t *idxp,checkpoint_t *v_chk,bool walflush)

{
  int iVar1;
  storage_t *ptr_fhandle;
  long lVar2;
  
  ptr_fhandle = (storage_t *)malloc(0x50);
  ptr_fhandle->v_chk = v_chk;
  ptr_fhandle->index_params = idxp;
  ptr_fhandle->walflush = walflush;
  ptr_fhandle->verify_set = true;
  lVar2 = 0x48;
  do {
    iVar1 = rand();
    ptr_fhandle->keyspace[lVar2 + -0x48] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar1 % 0x3e]
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x4e);
  ptr_fhandle->keyspace[5] = '\0';
  fdb_open((fdb_file_handle **)ptr_fhandle,"e2edb_main",m_fconfig);
  fdb_kvs_open(ptr_fhandle->main,&ptr_fhandle->all_docs,"e2ekv_alldocs",kvs_config);
  fdb_kvs_open(ptr_fhandle->main,&ptr_fhandle->index1,"e2ekv_index1",kvs_config);
  fdb_kvs_open(ptr_fhandle->main,&ptr_fhandle->index2,"e2ekv_index2",kvs_config);
  fdb_set_log_callback(ptr_fhandle->all_docs,logCallbackFunc,"e2etest:all_docs");
  fdb_set_log_callback(ptr_fhandle->index1,logCallbackFunc,"e2etest:index1");
  fdb_set_log_callback(ptr_fhandle->index2,logCallbackFunc,"e2etest:index2");
  fdb_open(&ptr_fhandle->records,"e2edb_records",r_fconfig);
  fdb_kvs_open(ptr_fhandle->records,&ptr_fhandle->rtx,"e2ekv_rtx",kvs_config);
  fdb_kvs_open(ptr_fhandle->records,&ptr_fhandle->chk,"e2ekv_chk",kvs_config);
  fdb_set_log_callback(ptr_fhandle->rtx,logCallbackFunc,"e2etest:rtx");
  fdb_set_log_callback(ptr_fhandle->chk,logCallbackFunc,"e2etest:chk");
  return ptr_fhandle;
}

Assistant:

storage_t *init_storage(fdb_config *m_fconfig,
                  fdb_config *r_fconfig,
                  fdb_kvs_config *kvs_config,
                  idx_prams_t *idxp, checkpoint_t *v_chk,
                  bool walflush)
{

    storage_t *st = (storage_t *)malloc(sizeof(storage_t));
    st->v_chk = v_chk;
    st->index_params = idxp;
    st->walflush = walflush;
    st->verify_set = true;
    gen_random(st->keyspace, KEYSPACE_LEN);

    // init dbs
    fdb_open(&st->main, E2EDB_MAIN, m_fconfig);
    fdb_kvs_open(st->main, &st->all_docs, E2EKV_ALLDOCS,  kvs_config);
    fdb_kvs_open(st->main, &st->index1, E2EKV_INDEX1,  kvs_config);
    fdb_kvs_open(st->main, &st->index2, E2EKV_INDEX2,  kvs_config);
    fdb_set_log_callback(st->all_docs, logCallbackFunc,
                         (void *) "e2etest:all_docs");
    fdb_set_log_callback(st->index1, logCallbackFunc,
                         (void *) "e2etest:index1");
    fdb_set_log_callback(st->index2, logCallbackFunc,
                         (void *) "e2etest:index2");

    // use unique records db for each storage instance
    fdb_open(&st->records, E2EDB_RECORDS, r_fconfig);
    fdb_kvs_open(st->records, &st->rtx, E2EKV_RECORDS,  kvs_config);
    fdb_kvs_open(st->records, &st->chk, E2EKV_CHECKPOINTS,  kvs_config);
    fdb_set_log_callback(st->rtx, logCallbackFunc, (void *) "e2etest:rtx");
    fdb_set_log_callback(st->chk, logCallbackFunc, (void *) "e2etest:chk");
    return st;
}